

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winfnt.c
# Opt level: O2

FT_Error FNT_Size_Select(FT_Size size,FT_ULong strike_index)

{
  ushort uVar1;
  long lVar2;
  
  lVar2 = size->face[1].num_faces;
  FT_Select_Metrics(size->face,0);
  uVar1 = *(ushort *)(lVar2 + 0x5c);
  (size->metrics).ascender = (ulong)uVar1 << 6;
  (size->metrics).descender = ((ulong)uVar1 - (ulong)*(ushort *)(lVar2 + 0x6c)) * 0x40;
  (size->metrics).max_advance = (ulong)*(ushort *)(lVar2 + 0x72) << 6;
  return 0;
}

Assistant:

static FT_Error
  FNT_Size_Select( FT_Size   size,
                   FT_ULong  strike_index )
  {
    FNT_Face          face   = (FNT_Face)size->face;
    FT_WinFNT_Header  header = &face->font->header;

    FT_UNUSED( strike_index );


    FT_Select_Metrics( size->face, 0 );

    size->metrics.ascender    = header->ascent * 64;
    size->metrics.descender   = -( header->pixel_height -
                                   header->ascent ) * 64;
    size->metrics.max_advance = header->max_width * 64;

    return FT_Err_Ok;
  }